

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::MILSpec::Value::MergeFrom(Value *this,Value *from)

{
  ulong uVar1;
  LogMessage *other;
  ValueType *pVVar2;
  Value_ImmediateValue *pVVar3;
  Value_BlobFileValue *pVVar4;
  undefined8 *puVar5;
  ulong uVar6;
  undefined1 *puVar7;
  Arena *pAVar8;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O1/mlmodel/format/MIL.pb.cc"
               ,0x17fc);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  uVar6 = (ulong)(from->docstring_).tagged_ptr_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar6 + 8) != 0) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar5 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar5 = (undefined8 *)*puVar5;
    }
    google::protobuf::internal::ArenaStringPtr::Set(&this->docstring_,uVar6,puVar5);
  }
  if ((from != (Value *)_Value_default_instance_) && (from->type_ != (ValueType *)0x0)) {
    if (this->type_ == (ValueType *)0x0) {
      uVar6 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar8 = (Arena *)(uVar6 & 0xfffffffffffffffc);
      if ((uVar6 & 1) != 0) {
        pAVar8 = *(Arena **)pAVar8;
      }
      pVVar2 = google::protobuf::Arena::
               CreateMaybeMessage<CoreML::Specification::MILSpec::ValueType>(pAVar8);
      this->type_ = pVVar2;
    }
    puVar7 = (undefined1 *)from->type_;
    if ((ValueType *)puVar7 == (ValueType *)0x0) {
      puVar7 = _ValueType_default_instance_;
    }
    ValueType::MergeFrom(this->type_,(ValueType *)puVar7);
  }
  if (from->_oneof_case_[0] == 5) {
    if (this->_oneof_case_[0] != 5) {
      clear_value(this);
      this->_oneof_case_[0] = 5;
      uVar6 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar8 = (Arena *)(uVar6 & 0xfffffffffffffffc);
      if ((uVar6 & 1) != 0) {
        pAVar8 = *(Arena **)pAVar8;
      }
      pVVar4 = google::protobuf::Arena::
               CreateMaybeMessage<CoreML::Specification::MILSpec::Value_BlobFileValue>(pAVar8);
      (this->value_).blobfilevalue_ = pVVar4;
    }
    if (from->_oneof_case_[0] == 5) {
      puVar7 = (undefined1 *)(from->value_).blobfilevalue_;
    }
    else {
      puVar7 = _Value_BlobFileValue_default_instance_;
    }
    Value_BlobFileValue::MergeFrom((this->value_).blobfilevalue_,(Value_BlobFileValue *)puVar7);
  }
  else if (from->_oneof_case_[0] == 3) {
    if (this->_oneof_case_[0] != 3) {
      clear_value(this);
      this->_oneof_case_[0] = 3;
      uVar6 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar8 = (Arena *)(uVar6 & 0xfffffffffffffffc);
      if ((uVar6 & 1) != 0) {
        pAVar8 = *(Arena **)pAVar8;
      }
      pVVar3 = google::protobuf::Arena::
               CreateMaybeMessage<CoreML::Specification::MILSpec::Value_ImmediateValue>(pAVar8);
      (this->value_).immediatevalue_ = pVVar3;
    }
    if (from->_oneof_case_[0] == 3) {
      puVar7 = (undefined1 *)(from->value_).immediatevalue_;
    }
    else {
      puVar7 = _Value_ImmediateValue_default_instance_;
    }
    Value_ImmediateValue::MergeFrom((this->value_).immediatevalue_,(Value_ImmediateValue *)puVar7);
  }
  uVar6 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar6 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar6 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

void Value::MergeFrom(const Value& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.MILSpec.Value)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (!from._internal_docstring().empty()) {
    _internal_set_docstring(from._internal_docstring());
  }
  if (from._internal_has_type()) {
    _internal_mutable_type()->::CoreML::Specification::MILSpec::ValueType::MergeFrom(from._internal_type());
  }
  switch (from.value_case()) {
    case kImmediateValue: {
      _internal_mutable_immediatevalue()->::CoreML::Specification::MILSpec::Value_ImmediateValue::MergeFrom(from._internal_immediatevalue());
      break;
    }
    case kBlobFileValue: {
      _internal_mutable_blobfilevalue()->::CoreML::Specification::MILSpec::Value_BlobFileValue::MergeFrom(from._internal_blobfilevalue());
      break;
    }
    case VALUE_NOT_SET: {
      break;
    }
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}